

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_parent_path_alloc
              (ext_key *hdkey,uint32_t *child_path,size_t child_path_len,uint32_t flags,
              ext_key **output)

{
  ext_key *peVar1;
  int ret;
  ext_key **output_local;
  uint32_t flags_local;
  size_t child_path_len_local;
  uint32_t *child_path_local;
  ext_key *hdkey_local;
  
  if (output == (ext_key **)0x0) {
    hdkey_local._4_4_ = -2;
  }
  else {
    peVar1 = (ext_key *)wally_calloc(0xc0);
    *output = peVar1;
    if (*output == (ext_key *)0x0) {
      hdkey_local._4_4_ = -3;
    }
    else {
      hdkey_local._4_4_ = bip32_key_from_parent_path(hdkey,child_path,child_path_len,flags,*output);
      if (hdkey_local._4_4_ != 0) {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return hdkey_local._4_4_;
}

Assistant:

int bip32_key_from_parent_path_alloc(const struct ext_key *hdkey,
                                     const uint32_t *child_path, size_t child_path_len,
                                     uint32_t flags,
                                     struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_from_parent_path(hdkey, child_path, child_path_len,
                                     flags, *output);
    if (ret != WALLY_OK) {
        wally_free(*output);
        *output = NULL;
    }
    return ret;
}